

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QAbstractItemModelPrivate::Change>::
emplace<QAbstractItemModelPrivate::Change_const&>
          (QMovableArrayOps<QAbstractItemModelPrivate::Change> *this,qsizetype i,Change *args)

{
  bool bVar1;
  qsizetype qVar2;
  Change *pCVar3;
  void *in_RDX;
  Change *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  Change tmp;
  Change *in_stack_ffffffffffffff58;
  QArrayDataPointer<QAbstractItemModelPrivate::Change> *in_stack_ffffffffffffff60;
  Inserter *this_00;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined1 uVar4;
  GrowthPosition in_stack_ffffffffffffff7c;
  QArrayDataPointer<QAbstractItemModelPrivate::Change> *in_stack_ffffffffffffff80;
  Inserter local_58;
  undefined1 local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QArrayDataPointer<QAbstractItemModelPrivate::Change>::needsDetach
                    (in_stack_ffffffffffffff60);
  if (!bVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar2 = QArrayDataPointer<QAbstractItemModelPrivate::Change>::freeSpaceAtEnd
                          ((QArrayDataPointer<QAbstractItemModelPrivate::Change> *)
                           CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68)),
       qVar2 != 0)) {
      pCVar3 = QArrayDataPointer<QAbstractItemModelPrivate::Change>::end(in_stack_ffffffffffffff60);
      memcpy(pCVar3,in_RDX,0x28);
      in_RDI->displaceTo = (Change *)((long)&(in_RDI->displaceTo->parent).r + 1);
      goto LAB_00822a79;
    }
    if ((in_RSI == (Change *)0x0) &&
       (qVar2 = QArrayDataPointer<QAbstractItemModelPrivate::Change>::freeSpaceAtBegin
                          ((QArrayDataPointer<QAbstractItemModelPrivate::Change> *)
                           CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68)),
       qVar2 != 0)) {
      pCVar3 = QArrayDataPointer<QAbstractItemModelPrivate::Change>::begin
                         ((QArrayDataPointer<QAbstractItemModelPrivate::Change> *)0x82291f);
      memcpy(pCVar3 + -1,in_RDX,0x28);
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (Change *)((long)&(in_RDI->displaceTo->parent).r + 1);
      goto LAB_00822a79;
    }
  }
  memset(local_30,0xaa,0x28);
  memcpy(local_30,in_RDX,0x28);
  bVar1 = in_RDI->displaceTo != (Change *)0x0;
  uVar4 = bVar1 && in_RSI == (Change *)0x0;
  QArrayDataPointer<QAbstractItemModelPrivate::Change>::detachAndGrow
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,(qsizetype)in_RDI,
             (Change **)CONCAT17(uVar4,in_stack_ffffffffffffff68),in_stack_ffffffffffffff60);
  if (bVar1 && in_RSI == (Change *)0x0) {
    pCVar3 = QArrayDataPointer<QAbstractItemModelPrivate::Change>::begin
                       ((QArrayDataPointer<QAbstractItemModelPrivate::Change> *)0x8229eb);
    memcpy(pCVar3 + -1,local_30,0x28);
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (Change *)((long)&(in_RDI->displaceTo->parent).r + 1);
  }
  else {
    this_00 = &local_58;
    Inserter::Inserter(in_RDI,(QArrayDataPointer<QAbstractItemModelPrivate::Change> *)
                              CONCAT17(uVar4,in_stack_ffffffffffffff68),(qsizetype)this_00,
                       (qsizetype)in_stack_ffffffffffffff58);
    Inserter::insertOne(this_00,in_stack_ffffffffffffff58);
    Inserter::~Inserter(&local_58);
  }
LAB_00822a79:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }